

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O1

void __thiscall
ExecutorTest_LambdaCall_Test::~ExecutorTest_LambdaCall_Test(ExecutorTest_LambdaCall_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExecutorTest, LambdaCall)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    let x: f32 = (\(y: f32, z: f32): f32 = { ret y + z; })(1, 2);
    print("" : x);
    ret 0;
  }
  )SRC";

  std::string expected = "3.000000\n";

  testProgram(source, expected, 0);
}